

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

void __thiscall IRBuilder::BuildEmpty(IRBuilder *this,OpCode newOpcode,uint32 offset)

{
  Func *pFVar1;
  code *pcVar2;
  byte bVar3;
  bool bVar4;
  RegSlot RVar5;
  uint uVar6;
  LabelInstr *branchTarget;
  Type *pTVar7;
  bool *pbVar8;
  BranchInstr *pBVar9;
  uint *puVar10;
  undefined4 *puVar11;
  IntConstOpnd *pIVar12;
  JITTimeFunctionBody *pJVar13;
  RegOpnd *pRVar14;
  Instr *pIVar15;
  RegOpnd *pRVar16;
  RegOpnd *src2Opnd;
  undefined6 in_register_00000032;
  SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
  *pSVar17;
  int iVar18;
  
  Js::ByteCodeReader::Empty(&this->m_jnReader);
  iVar18 = (int)CONCAT62(in_register_00000032,newOpcode);
  branchTarget = (LabelInstr *)IR::Instr::New(newOpcode,this->m_func);
  if (iVar18 < 0xea) {
    if (iVar18 == 8) {
      bVar4 = Func::IsJitInDebugMode(this->m_func);
      if (bVar4) {
        InsertBailOutForDebugger(this,offset,BailOutExplicit,(Instr *)0x0);
        return;
      }
      goto LAB_004c527b;
    }
    if (iVar18 == 0x24) {
      pRVar14 = BuildDstOpnd(this,0,TyVar,false,false);
      if ((branchTarget->super_Instr).m_src1 != (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
        if (!bVar4) goto LAB_004c5552;
        *puVar11 = 0;
      }
      pFVar1 = (branchTarget->super_Instr).m_func;
      if ((pRVar14->super_Opnd).isDeleted == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x14,"(!isDeleted)","Using deleted operand");
        if (!bVar4) goto LAB_004c5552;
        *puVar11 = 0;
      }
      bVar3 = (pRVar14->super_Opnd).field_0xb;
      if ((bVar3 & 2) != 0) {
        pRVar14 = (RegOpnd *)IR::Opnd::Copy(&pRVar14->super_Opnd,pFVar1);
        bVar3 = (pRVar14->super_Opnd).field_0xb;
      }
      (pRVar14->super_Opnd).field_0xb = bVar3 | 2;
      (branchTarget->super_Instr).m_src1 = &pRVar14->super_Opnd;
      goto LAB_004c527b;
    }
    if (iVar18 != 0xdc) goto LAB_004c527b;
    pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    RVar5 = JITTimeFunctionBody::GetLocalClosureReg(pJVar13);
    pRVar14 = BuildSrcOpnd(this,RVar5,TyVar);
    branchTarget = IR::LabelInstr::New(Label,this->m_func,false);
    pRVar16 = IR::RegOpnd::New(TyVar,this->m_func);
    pIVar15 = IR::Instr::New(LdFuncExpr,&pRVar16->super_Opnd,this->m_func);
    AddInstr(this,pIVar15,offset);
    pBVar9 = IR::BranchInstr::New
                       (BrFncCachedScopeNeq,branchTarget,&pRVar16->super_Opnd,&pRVar14->super_Opnd,
                        this->m_func);
    AddInstr(this,&pBVar9->super_Instr,offset);
    pIVar15 = IR::Instr::New(CommitScope,this->m_func);
    if (pIVar15->m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar4) goto LAB_004c5552;
      *puVar11 = 0;
    }
    pFVar1 = pIVar15->m_func;
    if ((pRVar14->super_Opnd).isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar4) goto LAB_004c5552;
      *puVar11 = 0;
    }
    bVar3 = (pRVar14->super_Opnd).field_0xb;
    if ((bVar3 & 2) != 0) {
      pRVar14 = (RegOpnd *)IR::Opnd::Copy(&pRVar14->super_Opnd,pFVar1);
      bVar3 = (pRVar14->super_Opnd).field_0xb;
    }
    (pRVar14->super_Opnd).field_0xb = bVar3 | 2;
    pIVar15->m_src1 = &pRVar14->super_Opnd;
    AddInstr(this,pIVar15,offset);
  }
  else {
    if (0x16f < iVar18) {
      if (iVar18 == 0x170) {
        pSVar17 = this->handlerOffsetStack;
        if (pSVar17 !=
            (SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
             *)0x0) {
          if ((SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
               *)(pSVar17->
                 super_SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
                 ).super_SListNodeBase<Memory::ArenaAllocator>.next == pSVar17) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar11 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                               ,0x1ba4,"(!this->handlerOffsetStack->Empty())",
                               "!this->handlerOffsetStack->Empty()");
            if (!bVar4) goto LAB_004c5552;
            *puVar11 = 0;
            pSVar17 = this->handlerOffsetStack;
          }
          pTVar7 = SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
                   ::Head(&pSVar17->
                           super_SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
                         );
          pbVar8 = JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>::Second(pTVar7);
          if (*pbVar8 != false) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar11 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                               ,0x1ba5,"(this->handlerOffsetStack->Top().Second() == false)",
                               "this->handlerOffsetStack->Top().Second() == false");
            if (!bVar4) goto LAB_004c5552;
            *puVar11 = 0;
          }
          pSVar17 = this->handlerOffsetStack;
          SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
          ::Head(&pSVar17->
                  super_SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
                );
          SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
          ::RemoveHead(&pSVar17->
                        super_SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
                       ,pSVar17->allocator);
        }
        this->finallyBlockLevel = this->finallyBlockLevel + 1;
        branchTarget = (LabelInstr *)IR::Instr::New(Finally,this->m_func);
        goto LAB_004c527b;
      }
      if (iVar18 != 0x181) goto LAB_004c527b;
      if (this->m_paramScopeDone == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0x1bbe,"(!this->IsParamScopeDone())","!this->IsParamScopeDone()");
        if (!bVar4) goto LAB_004c5552;
        *puVar11 = 0;
      }
      this->m_paramScopeDone = true;
      pFVar1 = this->m_func;
      if (pFVar1->m_localClosureSym == (StackSym *)0x0) {
        pJVar13 = JITTimeWorkItem::GetJITFunctionBody(pFVar1->m_workItem);
        uVar6 = JITTimeFunctionBody::GetScopeSlotArraySize(pJVar13);
        if (uVar6 == 0) {
          pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
          bVar4 = JITTimeFunctionBody::HasScopeObject(pJVar13);
          if (bVar4) goto LAB_004c52bc;
        }
        else {
LAB_004c52bc:
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar11 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                             ,0x1bc8,
                             "(this->m_func->GetJITFunctionBody()->GetScopeSlotArraySize() == 0 && !this->m_func->GetJITFunctionBody()->HasScopeObject())"
                             ,
                             "this->m_func->GetJITFunctionBody()->GetScopeSlotArraySize() == 0 && !this->m_func->GetJITFunctionBody()->HasScopeObject()"
                            );
          if (!bVar4) {
LAB_004c5552:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar11 = 0;
        }
        pIVar12 = IR::IntConstOpnd::New(0,TyVar,this->m_func,false);
      }
      else {
        pIVar12 = (IntConstOpnd *)IR::RegOpnd::New(pFVar1->m_localClosureSym,TyVar,pFVar1);
      }
      pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      RVar5 = JITTimeFunctionBody::GetParamClosureReg(pJVar13);
      pRVar14 = BuildDstOpnd(this,RVar5,TyVar,false,false);
      pIVar15 = IR::Instr::New(Ld_A,&pRVar14->super_Opnd,&pIVar12->super_Opnd,this->m_func);
      AddInstr(this,pIVar15,offset);
      iVar18 = (int)pIVar15;
      pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      uVar6 = JITTimeFunctionBody::GetScopeSlotArraySize(pJVar13);
      if (uVar6 == 0) {
        pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        bVar4 = JITTimeFunctionBody::HasScopeObject(pJVar13);
        if (!bVar4) {
          return;
        }
      }
      pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      bVar4 = JITTimeFunctionBody::HasScopeObject(pJVar13);
      pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      if (bVar4) {
        bVar4 = JITTimeFunctionBody::HasCachedScopePropIds(pJVar13);
        if (bVar4) {
          BuildInitCachedScope(this,iVar18,-1);
          goto LAB_004c5493;
        }
        pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        RVar5 = JITTimeFunctionBody::GetLocalClosureReg(pJVar13);
        pRVar14 = BuildDstOpnd(this,RVar5,TyVar,false,false);
        pIVar15 = IR::Instr::New(NewScopeObject,&pRVar14->super_Opnd,this->m_func);
      }
      else {
        RVar5 = JITTimeFunctionBody::GetLocalClosureReg(pJVar13);
        pRVar14 = BuildDstOpnd(this,RVar5,TyVar,false,false);
        pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        uVar6 = JITTimeFunctionBody::GetScopeSlotArraySize(pJVar13);
        pIVar12 = IR::IntConstOpnd::New((ulong)(uVar6 + 2),TyUint32,this->m_func,false);
        pIVar15 = IR::Instr::New(NewScopeSlots,&pRVar14->super_Opnd,&pIVar12->super_Opnd,
                                 this->m_func);
      }
      AddInstr(this,pIVar15,0xffffffff);
LAB_004c5493:
      pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      RVar5 = JITTimeFunctionBody::GetLocalFrameDisplayReg(pJVar13);
      pRVar14 = BuildDstOpnd(this,RVar5,TyVar,false,false);
      pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      RVar5 = JITTimeFunctionBody::GetLocalClosureReg(pJVar13);
      pRVar16 = BuildDstOpnd(this,RVar5,TyVar,false,false);
      pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      RVar5 = JITTimeFunctionBody::GetLocalFrameDisplayReg(pJVar13);
      src2Opnd = BuildDstOpnd(this,RVar5,TyVar,false,false);
      pIVar15 = IR::Instr::New(LdFrameDisplay,&pRVar14->super_Opnd,&pRVar16->super_Opnd,
                               &src2Opnd->super_Opnd,this->m_func);
      AddInstr(this,pIVar15,0xffffffff);
      pIVar15->field_0x38 = pIVar15->field_0x38 | 4;
      return;
    }
    if (iVar18 == 0xea) {
      this->finallyBlockLevel = this->finallyBlockLevel - 1;
      goto LAB_004c527b;
    }
    if (iVar18 != 0xeb) goto LAB_004c527b;
    pSVar17 = this->handlerOffsetStack;
    if ((pSVar17 !=
         (SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
          *)0x0) &&
       ((SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
         *)(pSVar17->
           super_SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
           ).super_SListNodeBase<Memory::ArenaAllocator>.next != pSVar17)) {
      pTVar7 = SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
               ::Head(&pSVar17->
                       super_SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
                     );
      pbVar8 = JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>::Second(pTVar7);
      if (*pbVar8 == true) {
        pBVar9 = IR::BranchInstr::New(BrOnException,(LabelInstr *)0x0,this->m_func);
        pTVar7 = SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
                 ::Head(&this->handlerOffsetStack->
                         super_SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
                       );
        puVar10 = JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>::First(pTVar7);
        AddBranchInstr(this,pBVar9,offset,*puVar10);
      }
    }
    branchTarget = IR::LabelInstr::New(Label,this->m_func,false);
    pBVar9 = IR::BranchInstr::New(Leave,branchTarget,this->m_func);
    AddInstr(this,&pBVar9->super_Instr,offset);
  }
  offset = 0xffffffff;
LAB_004c527b:
  AddInstr(this,&branchTarget->super_Instr,offset);
  return;
}

Assistant:

void
IRBuilder::BuildEmpty(Js::OpCode newOpcode, uint32 offset)
{
    IR::Instr *instr;

    m_jnReader.Empty();

    instr = IR::Instr::New(newOpcode, m_func);

    switch (newOpcode)
    {
    case Js::OpCode::CommitScope:
    {
        IR::RegOpnd *   src1Opnd;

        src1Opnd = this->BuildSrcOpnd(m_func->GetJITFunctionBody()->GetLocalClosureReg());

        IR::LabelInstr *labelNull = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);

        IR::RegOpnd * funcExprOpnd = IR::RegOpnd::New(TyVar, m_func);
        instr = IR::Instr::New(Js::OpCode::LdFuncExpr, funcExprOpnd, m_func);
        this->AddInstr(instr, offset);

        IR::BranchInstr *branchInstr = IR::BranchInstr::New(Js::OpCode::BrFncCachedScopeNeq, labelNull,
            funcExprOpnd, src1Opnd, this->m_func);
        this->AddInstr(branchInstr, offset);

        instr = IR::Instr::New(newOpcode, this->m_func);
        instr->SetSrc1(src1Opnd);

        this->AddInstr(instr, offset);

        this->AddInstr(labelNull, Js::Constants::NoByteCodeOffset);
        return;
    }
    case Js::OpCode::Ret:
    {
        IR::RegOpnd *regOpnd = BuildDstOpnd(0);
        instr->SetSrc1(regOpnd);
        this->AddInstr(instr, offset);
        break;
    }

    case Js::OpCode::Leave:
    {
        IR::BranchInstr * branchInstr;
        IR::LabelInstr * labelInstr;

        if (this->handlerOffsetStack && !this->handlerOffsetStack->Empty() && this->handlerOffsetStack->Top().Second())
        {
            // If the try region has a break block, we don't want the Flowgraph to move all of that code out of the loop
            // because an exception will bring the control back into the loop. The branch out of the loop (which is the
            // reason for the code to be a break block) can still be moved out though.
            //
            // "BrOnException $catch" is inserted before Leave's in the try region to instrument flow from the try region
            // to the catch region (which is in the loop).
            IR::BranchInstr * brOnException = IR::BranchInstr::New(Js::OpCode::BrOnException, nullptr, this->m_func);
            this->AddBranchInstr(brOnException, offset, this->handlerOffsetStack->Top().First());
        }

        labelInstr = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
        branchInstr = IR::BranchInstr::New(newOpcode, labelInstr, this->m_func);
        this->AddInstr(branchInstr, offset);
        this->AddInstr(labelInstr, Js::Constants::NoByteCodeOffset);
        break;
    }

    case Js::OpCode::LeaveNull:
        finallyBlockLevel--;
        this->AddInstr(instr, offset);
        break;

    case Js::OpCode::Finally:
        if (this->handlerOffsetStack)
        {
            AssertOrFailFast(!this->handlerOffsetStack->Empty());
            AssertOrFailFast(this->handlerOffsetStack->Top().Second() == false);
            this->handlerOffsetStack->Pop();
        }
        finallyBlockLevel++;
        this->AddInstr(IR::Instr::New(Js::OpCode::Finally, this->m_func), offset);
        break;

    case Js::OpCode::Break:
        if (m_func->IsJitInDebugMode())
        {
            // Add explicit bailout.
            this->InsertBailOutForDebugger(offset, IR::BailOutExplicit);
        }
        else
        {
            // Default behavior, let's keep it for now, removed in lowerer.
            this->AddInstr(instr, offset);
        }
        break;

    case Js::OpCode::BeginBodyScope:
    {
        // This marks the end of a param scope which is not merged with body scope.
        // So we have to first cache the closure so that we can use it to copy the initial values for
        // body syms from corresponding param syms (LdParamSlot). Body should get its own scope slot.
        Assert(!this->IsParamScopeDone());
        this->SetParamScopeDone();

        IR::Opnd * localClosureOpnd;
        if (this->m_func->GetLocalClosureSym() != nullptr)
        {
            localClosureOpnd = IR::RegOpnd::New(this->m_func->GetLocalClosureSym(), TyVar, this->m_func);
        }
        else
        {
            AssertOrFailFast(this->m_func->GetJITFunctionBody()->GetScopeSlotArraySize() == 0 && !this->m_func->GetJITFunctionBody()->HasScopeObject());
            localClosureOpnd = IR::IntConstOpnd::New(0, TyVar, this->m_func);
        }

        this->AddInstr(
            IR::Instr::New(
                Js::OpCode::Ld_A,
                this->BuildDstOpnd(this->m_func->GetJITFunctionBody()->GetParamClosureReg()),
                localClosureOpnd,
                this->m_func),
            offset);

        // Create a new local closure for the body when either body scope has scope slots allocated or
        // eval is present which can leak declarations.
        if (this->m_func->GetJITFunctionBody()->GetScopeSlotArraySize() > 0 || this->m_func->GetJITFunctionBody()->HasScopeObject())
        {
            if (this->m_func->GetJITFunctionBody()->HasScopeObject())
            {
                if (this->m_func->GetJITFunctionBody()->HasCachedScopePropIds())
                {
                    this->BuildInitCachedScope(0, Js::Constants::NoByteCodeOffset);
                }
                else
                {
                    this->AddInstr(
                        IR::Instr::New(
                            Js::OpCode::NewScopeObject,
                            this->BuildDstOpnd(this->m_func->GetJITFunctionBody()->GetLocalClosureReg()),
                            m_func),
                        Js::Constants::NoByteCodeOffset);
                }
            }
            else
            {
                this->AddInstr(
                    IR::Instr::New(
                        Js::OpCode::NewScopeSlots,
                        this->BuildDstOpnd(this->m_func->GetJITFunctionBody()->GetLocalClosureReg()),
                        IR::IntConstOpnd::New(this->m_func->GetJITFunctionBody()->GetScopeSlotArraySize() + Js::ScopeSlots::FirstSlotIndex, TyUint32, this->m_func),
                        m_func),
                    Js::Constants::NoByteCodeOffset);
            }

            IR::Instr* lfd = IR::Instr::New(
                Js::OpCode::LdFrameDisplay,
                this->BuildDstOpnd(this->m_func->GetJITFunctionBody()->GetLocalFrameDisplayReg()),
                this->BuildDstOpnd(this->m_func->GetJITFunctionBody()->GetLocalClosureReg()),
                this->BuildDstOpnd(this->m_func->GetJITFunctionBody()->GetLocalFrameDisplayReg()),
                this->m_func);
            this->AddInstr(
                lfd,
                Js::Constants::NoByteCodeOffset);
            lfd->isNonFastPathFrameDisplay = true;
        }
        break;
    }

    default:
        this->AddInstr(instr, offset);
        break;
    }
}